

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_file.cc
# Opt level: O0

int X509_load_crl_file(X509_LOOKUP *ctx,char *file,int type)

{
  int iVar1;
  BIO_METHOD *type_00;
  BIO *bp;
  ulong uVar2;
  X509_CRL *pXStack_38;
  uint32_t error;
  X509_CRL *x;
  int count;
  int i;
  BIO *in;
  int ret;
  int type_local;
  char *file_local;
  X509_LOOKUP *ctx_local;
  
  in._0_4_ = 0;
  x._0_4_ = 0;
  pXStack_38 = (X509_CRL *)0x0;
  type_00 = BIO_s_file();
  bp = BIO_new(type_00);
  if ((bp == (BIO *)0x0) || (iVar1 = BIO_read_filename((BIO *)bp,file), iVar1 < 1)) {
    ERR_put_error(0xb,0,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                  ,0x7f);
    goto LAB_0031118d;
  }
  if (type == 1) {
    while (pXStack_38 = PEM_read_bio_X509_CRL(bp,(X509_CRL **)0x0,(undefined1 *)0x0,(void *)0x0),
          pXStack_38 != (X509_CRL *)0x0) {
      iVar1 = X509_STORE_add_crl((X509_STORE *)ctx->method_data,pXStack_38);
      if (iVar1 == 0) goto LAB_0031118d;
      x._0_4_ = (int)x + 1;
      X509_CRL_free(pXStack_38);
    }
    uVar2 = ERR_peek_last_error();
    iVar1 = ERR_GET_LIB((uint32_t)uVar2);
    if (((iVar1 != 9) || (iVar1 = ERR_GET_REASON((uint32_t)uVar2), iVar1 != 0x6e)) || ((int)x < 1))
    {
      ERR_put_error(0xb,0,9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                    ,0x8d);
      goto LAB_0031118d;
    }
    ERR_clear_error();
    in._0_4_ = (int)x;
    iVar1 = (int)in;
  }
  else {
    if (type != 2) {
      ERR_put_error(0xb,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                    ,0xa5);
      goto LAB_0031118d;
    }
    pXStack_38 = d2i_X509_CRL_bio(bp,(X509_CRL **)0x0);
    if (pXStack_38 == (X509_CRL *)0x0) {
      ERR_put_error(0xb,0,0xc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                    ,0x9c);
      goto LAB_0031118d;
    }
    iVar1 = X509_STORE_add_crl((X509_STORE *)ctx->method_data,pXStack_38);
    if (iVar1 == 0) goto LAB_0031118d;
  }
  in._0_4_ = iVar1;
  if ((int)in == 0) {
    ERR_put_error(0xb,0,0x8f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                  ,0xaa);
  }
LAB_0031118d:
  X509_CRL_free(pXStack_38);
  BIO_free(bp);
  return (int)in;
}

Assistant:

int X509_load_crl_file(X509_LOOKUP *ctx, const char *file, int type) {
  int ret = 0;
  BIO *in = NULL;
  int i, count = 0;
  X509_CRL *x = NULL;

  in = BIO_new(BIO_s_file());

  if ((in == NULL) || (BIO_read_filename(in, file) <= 0)) {
    OPENSSL_PUT_ERROR(X509, ERR_R_SYS_LIB);
    goto err;
  }

  if (type == X509_FILETYPE_PEM) {
    for (;;) {
      x = PEM_read_bio_X509_CRL(in, NULL, NULL, NULL);
      if (x == NULL) {
        uint32_t error = ERR_peek_last_error();
        if (ERR_GET_LIB(error) == ERR_LIB_PEM &&
            ERR_GET_REASON(error) == PEM_R_NO_START_LINE && count > 0) {
          ERR_clear_error();
          break;
        }
        OPENSSL_PUT_ERROR(X509, ERR_R_PEM_LIB);
        goto err;
      }
      i = X509_STORE_add_crl(ctx->store_ctx, x);
      if (!i) {
        goto err;
      }
      count++;
      X509_CRL_free(x);
      x = NULL;
    }
    ret = count;
  } else if (type == X509_FILETYPE_ASN1) {
    x = d2i_X509_CRL_bio(in, NULL);
    if (x == NULL) {
      OPENSSL_PUT_ERROR(X509, ERR_R_ASN1_LIB);
      goto err;
    }
    i = X509_STORE_add_crl(ctx->store_ctx, x);
    if (!i) {
      goto err;
    }
    ret = i;
  } else {
    OPENSSL_PUT_ERROR(X509, X509_R_BAD_X509_FILETYPE);
    goto err;
  }

  if (ret == 0) {
    OPENSSL_PUT_ERROR(X509, X509_R_NO_CRL_FOUND);
  }

err:
  X509_CRL_free(x);
  BIO_free(in);
  return ret;
}